

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

ssize_t serialize::write(int __fd,void *__buf,size_t __n)

{
  string *ostream_;
  uint32_t size_00;
  char *p;
  undefined4 in_register_0000003c;
  uint local_1c;
  void *pvStack_18;
  uint32_t size;
  string *string__local;
  ostream *ostream__local;
  
  string__local = (string *)CONCAT44(in_register_0000003c,__fd);
  pvStack_18 = __buf;
  local_1c = std::__cxx11::string::size();
  write<unsigned_int>((ostream *)string__local,&local_1c);
  ostream_ = string__local;
  p = (char *)std::__cxx11::string::c_str();
  size_00 = std::__cxx11::string::size();
  write_internal((ostream *)ostream_,p,size_00);
  return (ssize_t)string__local;
}

Assistant:

static inline ostream& write (ostream& ostream_, const std::string& string_)
    {
        uint32_t size = string_.size();
        write (ostream_, size);
        write_internal (ostream_, string_.c_str(), string_.size());
        return ostream_;
    }